

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

shared_ptr<rcg::Device> rcg::getDevice(char *id,uint64_t timeout)

{
  __type _Var1;
  bool bVar2;
  char *pcVar3;
  element_type *peVar4;
  long lVar5;
  element_type *peVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  __shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar8;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int iVar10;
  char *in_RSI;
  char *pcVar11;
  element_type *in_RDI;
  shared_ptr<rcg::Device> sVar12;
  size_t k_1;
  shared_ptr<rcg::Device> dev_1;
  shared_ptr<rcg::Device> dev;
  size_t k;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  size_t i;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  System *in_stack_000000f8;
  size_t p;
  string devid;
  string interfid;
  int found;
  shared_ptr<rcg::Device> *ret;
  shared_ptr<rcg::Device> *in_stack_fffffffffffffe48;
  shared_ptr<rcg::Device> *in_stack_fffffffffffffe50;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *in_stack_fffffffffffffe60;
  element_type *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  byte local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  __shared_ptr local_120 [16];
  __shared_ptr local_110 [16];
  char *local_100;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_f8;
  char *local_e0;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> local_d8;
  string local_c0 [32];
  string local_a0 [32];
  long local_80;
  uint64_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  Interface *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [35];
  undefined1 local_1d;
  int local_1c;
  char *local_10;
  
  local_1c = 0;
  local_1d = 0;
  local_10 = in_RSI;
  std::shared_ptr<rcg::Device>::shared_ptr((shared_ptr<rcg::Device> *)0x11d824);
  _Var9._M_pi = extraout_RDX;
  if ((local_10 != (char *)0x0) && (*local_10 != '\0')) {
    std::__cxx11::string::string(local_40);
    pcVar11 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar11,(allocator *)&stack0xffffffffffffff9f);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    local_80 = std::__cxx11::string::find((char)local_60,0x3a);
    if (local_80 != -1) {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_60);
      std::__cxx11::string::operator=(local_40,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)local_60);
      std::__cxx11::string::operator=(local_60,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    System::getSystems();
    for (local_e0 = (char *)0x0; pcVar11 = local_e0,
        pcVar3 = (char *)std::
                         vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                         ::size(&local_d8), pcVar11 < pcVar3; local_e0 = local_e0 + 1) {
      pcVar11 = local_e0;
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      operator[](&local_d8,(size_type)local_e0);
      peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11d9fc);
      System::open(peVar4,pcVar11,__oflag);
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      operator[](&local_d8,(size_type)local_e0);
      std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11da23);
      System::getInterfaces(in_stack_000000f8);
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 0) {
        std::shared_ptr<rcg::Device>::shared_ptr((shared_ptr<rcg::Device> *)0x11dc32);
        local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        while( true ) {
          in_stack_fffffffffffffe70 = local_128;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                   ::size(&local_f8);
          local_181 = 0;
          if (in_stack_fffffffffffffe70 < pbVar7) {
            bVar2 = std::__shared_ptr::operator_cast_to_bool(local_120);
            local_181 = bVar2 ^ 0xff;
          }
          if ((local_181 & 1) == 0) break;
          pbVar7 = local_128;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_f8,(size_type)local_128);
          peVar6 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x11dca8);
          Interface::open(peVar6,(char *)pbVar7,__oflag_01);
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_f8,(size_type)local_128);
          in_stack_fffffffffffffe68 =
               std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11dccf);
          std::__cxx11::string::c_str();
          Interface::getDevice
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          std::shared_ptr<rcg::Device>::operator=
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x11dd22);
          bVar2 = std::__shared_ptr::operator_cast_to_bool(local_120);
          if (bVar2) {
            std::shared_ptr<rcg::Device>::operator=
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            local_1c = local_1c + 1;
          }
          pbVar7 = local_128;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_f8,(size_type)local_128);
          iVar10 = (int)pbVar7;
          peVar6 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x11dd9d);
          Interface::close(peVar6,iVar10);
          local_128 = local_128 + 1;
        }
        std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x11ddcf);
      }
      else {
        for (local_100 = (char *)0x0; pcVar11 = local_100,
            pcVar3 = (char *)std::
                             vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                             ::size(&local_f8), pcVar11 < pcVar3; local_100 = local_100 + 1) {
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_f8,(size_type)local_100);
          peVar6 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x11daa0);
          Interface::getID_abi_cxx11_(peVar6);
          _Var1 = std::operator==(in_stack_fffffffffffffe70,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe68);
          if (_Var1) {
            pcVar11 = local_100;
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::operator[](&local_f8,(size_type)local_100);
            peVar6 = std::
                     __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x11dae7);
            Interface::open(peVar6,pcVar11,__oflag_00);
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::operator[](&local_f8,(size_type)local_100);
            std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x11db0e);
            std::__cxx11::string::c_str();
            Interface::getDevice
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
            bVar2 = std::__shared_ptr::operator_cast_to_bool(local_110);
            if (bVar2) {
              std::shared_ptr<rcg::Device>::operator=
                        (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
              local_1c = local_1c + 1;
            }
            pcVar11 = local_100;
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::operator[](&local_f8,(size_type)local_100);
            iVar10 = (int)pcVar11;
            peVar6 = std::
                     __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x11dbc6);
            Interface::close(peVar6,iVar10);
            std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x11dbdd);
          }
        }
      }
      pcVar11 = local_e0;
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      operator[](&local_d8,(size_type)local_e0);
      iVar10 = (int)pcVar11;
      peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11ddec);
      System::close(peVar4,iVar10);
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      ~vector(in_stack_fffffffffffffe60);
    }
    std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
    ~vector((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *)
            in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (1 < local_1c) {
    this = (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)
           std::operator<<((ostream *)&std::cerr,"ERROR: Finding device \'");
    poVar8 = std::operator<<((ostream *)this,local_10);
    poVar8 = std::operator<<(poVar8,"\' through different producers.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::reset(this);
    _Var9._M_pi = extraout_RDX_01;
  }
  sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi
  ;
  sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<rcg::Device>)sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Device> getDevice(const char *id, uint64_t timeout)
{
  int found=0;
  std::shared_ptr<Device> ret;

  if (id != 0 && *id != '\0')
  {
    // split into interface and device id

    std::string interfid;
    std::string devid=id;

    size_t p=devid.find(':');
    if (p != std::string::npos)
    {
      interfid=devid.substr(0, p);
      devid=devid.substr(p+1);
    }

    // go through all systems

    std::vector<std::shared_ptr<System> > system=System::getSystems();

    for (size_t i=0; i<system.size(); i++)
    {
      system[i]->open();

      // get all interfaces

      std::vector<std::shared_ptr<Interface> > interf=system[i]->getInterfaces();

      if (interfid.size() > 0)
      {
        // if an interface is defined, then only search this interface

        for (size_t k=0; k<interf.size(); k++)
        {
          if (interf[k]->getID() == interfid)
          {
            interf[k]->open();

            std::shared_ptr<Device> dev=interf[k]->getDevice(devid.c_str(), timeout);

            if (dev)
            {
              ret=dev;
              found++;
            }

            interf[k]->close();
          }
        }
      }
      else
      {
        // if interface is not defined, then check all interfaces

        std::shared_ptr<Device> dev;
        for (size_t k=0; k<interf.size() && !dev; k++)
        {
          interf[k]->open();

          dev=interf[k]->getDevice(devid.c_str(), timeout);

          if (dev)
          {
            ret=dev;
            found++;
          }

          interf[k]->close();
        }
      }

      system[i]->close();
    }
  }

  if (found > 1)
  {
    std::cerr << "ERROR: Finding device '" << id << "' through different producers."
              << std::endl;
    ret.reset();
  }

  return ret;
}